

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_filter_lrzip.c
# Opt level: O0

void test_write_filter_lrzip(void)

{
  wchar_t wVar1;
  wchar_t wVar2;
  void *__ptr;
  void *__s;
  archive_entry *paVar3;
  archive_entry *entry;
  int i;
  size_t used2;
  size_t used1;
  char path [16];
  size_t datasize;
  size_t buffsize;
  char *data;
  char *buff;
  archive *a;
  archive_entry *ae;
  void *in_stack_ffffffffffffff78;
  int iVar7;
  archive *paVar4;
  archive_entry *paVar5;
  void *pvVar6;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 uVar8;
  uint in_stack_ffffffffffffff84;
  archive *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  archive *in_stack_ffffffffffffff98;
  wchar_t in_stack_ffffffffffffffa4;
  uint uVar9;
  char *in_stack_ffffffffffffffa8;
  void *in_stack_ffffffffffffffb0;
  archive_vtable_conflict *in_stack_ffffffffffffffc0;
  wchar_t in_stack_ffffffffffffffc8;
  archive *local_30;
  
  wVar1 = canLrzip();
  if (wVar1 == L'\0') {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                   ,L',');
    test_skipping("lrzip command-line program not found");
  }
  else {
    __ptr = malloc(2000000);
    assertion_assert(in_stack_ffffffffffffff90,(wchar_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                     (wchar_t)in_stack_ffffffffffffff88,
                     (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff78);
    local_30 = (archive *)0x2710;
    __s = malloc(10000);
    assertion_assert(in_stack_ffffffffffffff90,(wchar_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                     (wchar_t)in_stack_ffffffffffffff88,
                     (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff78);
    memset(__s,0,10000);
    paVar3 = (archive_entry *)archive_write_new();
    assertion_assert(in_stack_ffffffffffffff90,(wchar_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                     (wchar_t)in_stack_ffffffffffffff88,
                     (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff78);
    archive_write_set_format_gnutar(in_stack_ffffffffffffff88);
    assertion_equal_int((char *)in_stack_ffffffffffffff98,
                        (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                        (longlong)in_stack_ffffffffffffff88,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        (longlong)paVar3,(char *)0x1da48c,in_stack_ffffffffffffffb0);
    archive_write_add_filter_lrzip(in_stack_ffffffffffffff88);
    assertion_equal_int((char *)in_stack_ffffffffffffff98,
                        (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                        (longlong)in_stack_ffffffffffffff88,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        (longlong)paVar3,(char *)0x1da4c8,in_stack_ffffffffffffffb0);
    archive_write_set_bytes_per_block(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
    paVar5 = paVar3;
    assertion_equal_int((char *)in_stack_ffffffffffffff98,
                        (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                        (longlong)in_stack_ffffffffffffff88,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        (longlong)paVar3,(char *)0x1da506,in_stack_ffffffffffffffb0);
    archive_filter_code((archive *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        (int)((ulong)paVar5 >> 0x20));
    iVar7 = 0;
    assertion_equal_int((char *)in_stack_ffffffffffffff98,
                        (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                        (longlong)in_stack_ffffffffffffff88,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),0,
                        (char *)0x1da543,in_stack_ffffffffffffffb0);
    archive_filter_name((archive *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        iVar7);
    uVar8 = 0;
    assertion_equal_string
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(char *)in_stack_ffffffffffffff98
               ,in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
               (char *)((ulong)in_stack_ffffffffffffff84 << 0x20),in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffc8);
    archive_write_open_memory
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88
               ,(size_t *)CONCAT44(in_stack_ffffffffffffff84,uVar8));
    paVar5 = paVar3;
    assertion_equal_int((char *)in_stack_ffffffffffffff98,
                        (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                        (longlong)in_stack_ffffffffffffff88,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,uVar8),(longlong)paVar3,
                        (char *)0x1da5d4,in_stack_ffffffffffffffb0);
    entry = archive_entry_new();
    assertion_assert(in_stack_ffffffffffffff90,(wchar_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                     (wchar_t)in_stack_ffffffffffffff88,
                     (char *)CONCAT44(in_stack_ffffffffffffff84,uVar8),paVar5);
    archive_entry_set_filetype(entry,0x8000);
    archive_entry_set_size(entry,10000);
    for (uVar9 = 0; (int)uVar9 < 100; uVar9 = uVar9 + 1) {
      sprintf(&stack0xffffffffffffffb8,"file%03d",(ulong)uVar9);
      archive_entry_copy_pathname
                ((archive_entry *)CONCAT44(in_stack_ffffffffffffff84,uVar8),(char *)paVar5);
      archive_write_header((archive *)CONCAT44(in_stack_ffffffffffffff84,uVar8),paVar5);
      paVar5 = paVar3;
      assertion_equal_int((char *)in_stack_ffffffffffffff98,
                          (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                          (longlong)in_stack_ffffffffffffff88,
                          (char *)CONCAT44(in_stack_ffffffffffffff84,uVar8),(longlong)paVar3,
                          (char *)0x1da6ab,in_stack_ffffffffffffffb0);
      in_stack_ffffffffffffff98 = local_30;
      archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffff84,uVar8),paVar5,0x1da6c9);
      assertion_assert(in_stack_ffffffffffffff90,(wchar_t)((ulong)in_stack_ffffffffffffff88 >> 0x20)
                       ,(wchar_t)in_stack_ffffffffffffff88,
                       (char *)CONCAT44(in_stack_ffffffffffffff84,uVar8),paVar5);
    }
    archive_entry_free((archive_entry *)0x1da716);
    archive_write_close((archive *)0x1da720);
    assertion_equal_int((char *)in_stack_ffffffffffffff98,
                        (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                        (longlong)in_stack_ffffffffffffff88,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,uVar8),(longlong)paVar3,
                        (char *)0x1da74f,in_stack_ffffffffffffffb0);
    archive_write_free((archive *)0x1da759);
    paVar4 = (archive *)0x0;
    assertion_equal_int((char *)in_stack_ffffffffffffff98,
                        (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                        (longlong)in_stack_ffffffffffffff88,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,uVar8),0,(char *)0x1da787,
                        in_stack_ffffffffffffffb0);
    paVar3 = (archive_entry *)archive_read_new();
    assertion_assert(in_stack_ffffffffffffff90,(wchar_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                     (wchar_t)in_stack_ffffffffffffff88,
                     (char *)CONCAT44(in_stack_ffffffffffffff84,uVar8),paVar4);
    archive_read_support_format_all(paVar4);
    assertion_equal_int((char *)in_stack_ffffffffffffff98,
                        (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                        (longlong)in_stack_ffffffffffffff88,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,uVar8),(longlong)paVar3,
                        (char *)0x1da7f3,in_stack_ffffffffffffffb0);
    archive_read_support_filter_lrzip(in_stack_ffffffffffffff88);
    paVar5 = paVar3;
    assertion_equal_int((char *)in_stack_ffffffffffffff98,
                        (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                        (longlong)in_stack_ffffffffffffff88,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,uVar8),(longlong)paVar3,
                        (char *)0x1da82f,in_stack_ffffffffffffffb0);
    archive_read_open_memory((archive *)CONCAT44(in_stack_ffffffffffffff84,uVar8),paVar5,0x1da843);
    paVar5 = paVar3;
    assertion_equal_int((char *)in_stack_ffffffffffffff98,
                        (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                        (longlong)in_stack_ffffffffffffff88,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,uVar8),(longlong)paVar3,
                        (char *)0x1da872,in_stack_ffffffffffffffb0);
    for (wVar1 = L'\0'; wVar1 < L'd'; wVar1 = wVar1 + L'\x01') {
      sprintf(&stack0xffffffffffffffb8,"file%03d",(ulong)(uint)wVar1);
      archive_read_next_header
                ((archive *)CONCAT44(in_stack_ffffffffffffff84,uVar8),(archive_entry **)paVar5);
      paVar5 = (archive_entry *)0x0;
      wVar2 = assertion_equal_int((char *)in_stack_ffffffffffffff98,
                                  (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                                  (longlong)in_stack_ffffffffffffff88,
                                  (char *)CONCAT44(in_stack_ffffffffffffff84,uVar8),0,
                                  (char *)0x1da8dc,in_stack_ffffffffffffffb0);
      if (wVar2 == L'\0') break;
      in_stack_ffffffffffffff88 = (archive *)&stack0xffffffffffffffb8;
      archive_entry_pathname(paVar5);
      uVar8 = 0;
      assertion_equal_string
                (in_stack_ffffffffffffffa8,wVar1,(char *)in_stack_ffffffffffffff98,
                 in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
                 (char *)((ulong)in_stack_ffffffffffffff84 << 0x20),in_stack_ffffffffffffffc0,
                 in_stack_ffffffffffffffc8);
      in_stack_ffffffffffffff90 = (char *)0x2710;
      archive_entry_size(entry);
      paVar5 = (archive_entry *)0x0;
      assertion_equal_int((char *)in_stack_ffffffffffffff98,
                          (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                          (longlong)in_stack_ffffffffffffff88,
                          (char *)CONCAT44(in_stack_ffffffffffffff84,uVar8),0,(char *)0x1da982,
                          in_stack_ffffffffffffffb0);
    }
    archive_filter_code((archive *)CONCAT44(in_stack_ffffffffffffff84,uVar8),
                        (int)((ulong)paVar5 >> 0x20));
    iVar7 = 0;
    assertion_equal_int((char *)in_stack_ffffffffffffff98,
                        (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                        (longlong)in_stack_ffffffffffffff88,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,uVar8),0,(char *)0x1da9cf,
                        in_stack_ffffffffffffffb0);
    archive_filter_name((archive *)CONCAT44(in_stack_ffffffffffffff84,uVar8),iVar7);
    uVar8 = 0;
    assertion_equal_string
              (in_stack_ffffffffffffffa8,wVar1,(char *)in_stack_ffffffffffffff98,
               in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
               (char *)((ulong)in_stack_ffffffffffffff84 << 0x20),in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffc8);
    archive_read_close((archive *)0x1daa22);
    assertion_equal_int((char *)in_stack_ffffffffffffff98,
                        (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                        (longlong)in_stack_ffffffffffffff88,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,uVar8),(longlong)paVar3,
                        (char *)0x1daa51,in_stack_ffffffffffffffb0);
    archive_read_free((archive *)0x1daa5b);
    pvVar6 = (void *)0x0;
    assertion_equal_int((char *)in_stack_ffffffffffffff98,
                        (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                        (longlong)in_stack_ffffffffffffff88,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,uVar8),0,(char *)0x1daa89,
                        in_stack_ffffffffffffffb0);
    paVar4 = archive_write_new();
    assertion_assert(in_stack_ffffffffffffff90,(wchar_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                     (wchar_t)in_stack_ffffffffffffff88,
                     (char *)CONCAT44(in_stack_ffffffffffffff84,uVar8),pvVar6);
    archive_write_add_filter_lrzip(in_stack_ffffffffffffff88);
    assertion_equal_int((char *)in_stack_ffffffffffffff98,
                        (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                        (longlong)in_stack_ffffffffffffff88,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,uVar8),(longlong)paVar4,
                        (char *)0x1daaf8,in_stack_ffffffffffffffb0);
    archive_write_free((archive *)0x1dab02);
    pvVar6 = (void *)0x0;
    assertion_equal_int((char *)in_stack_ffffffffffffff98,
                        (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                        (longlong)in_stack_ffffffffffffff88,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,uVar8),0,(char *)0x1dab30,
                        in_stack_ffffffffffffffb0);
    paVar4 = archive_write_new();
    assertion_assert(in_stack_ffffffffffffff90,(wchar_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                     (wchar_t)in_stack_ffffffffffffff88,
                     (char *)CONCAT44(in_stack_ffffffffffffff84,uVar8),pvVar6);
    archive_write_add_filter_lrzip(in_stack_ffffffffffffff88);
    assertion_equal_int((char *)in_stack_ffffffffffffff98,
                        (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                        (longlong)in_stack_ffffffffffffff88,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,uVar8),(longlong)paVar4,
                        (char *)0x1dab9f,in_stack_ffffffffffffffb0);
    archive_write_close((archive *)0x1daba9);
    assertion_equal_int((char *)in_stack_ffffffffffffff98,
                        (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                        (longlong)in_stack_ffffffffffffff88,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,uVar8),0,(char *)0x1dabd7,
                        in_stack_ffffffffffffffb0);
    archive_write_free((archive *)0x1dabe1);
    pvVar6 = (void *)0x0;
    assertion_equal_int((char *)in_stack_ffffffffffffff98,
                        (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                        (longlong)in_stack_ffffffffffffff88,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,uVar8),0,(char *)0x1dac0f,
                        in_stack_ffffffffffffffb0);
    paVar4 = archive_write_new();
    assertion_assert(in_stack_ffffffffffffff90,(wchar_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                     (wchar_t)in_stack_ffffffffffffff88,
                     (char *)CONCAT44(in_stack_ffffffffffffff84,uVar8),pvVar6);
    archive_write_set_format_ustar(in_stack_ffffffffffffff88);
    assertion_equal_int((char *)in_stack_ffffffffffffff98,
                        (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                        (longlong)in_stack_ffffffffffffff88,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,uVar8),(longlong)paVar4,
                        (char *)0x1dac7b,in_stack_ffffffffffffffb0);
    archive_write_add_filter_lrzip(in_stack_ffffffffffffff88);
    assertion_equal_int((char *)in_stack_ffffffffffffff98,
                        (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                        (longlong)in_stack_ffffffffffffff88,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,uVar8),(longlong)paVar4,
                        (char *)0x1dacb7,in_stack_ffffffffffffffb0);
    archive_write_close((archive *)0x1dacc1);
    assertion_equal_int((char *)in_stack_ffffffffffffff98,
                        (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                        (longlong)in_stack_ffffffffffffff88,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,uVar8),0,(char *)0x1dacef,
                        in_stack_ffffffffffffffb0);
    archive_write_free((archive *)0x1dacf9);
    pvVar6 = (void *)0x0;
    assertion_equal_int((char *)in_stack_ffffffffffffff98,
                        (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                        (longlong)in_stack_ffffffffffffff88,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,uVar8),0,(char *)0x1dad27,
                        in_stack_ffffffffffffffb0);
    paVar4 = archive_write_new();
    assertion_assert(in_stack_ffffffffffffff90,(wchar_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                     (wchar_t)in_stack_ffffffffffffff88,
                     (char *)CONCAT44(in_stack_ffffffffffffff84,uVar8),pvVar6);
    archive_write_set_format_ustar(in_stack_ffffffffffffff88);
    assertion_equal_int((char *)in_stack_ffffffffffffff98,
                        (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                        (longlong)in_stack_ffffffffffffff88,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,uVar8),(longlong)paVar4,
                        (char *)0x1dad93,in_stack_ffffffffffffffb0);
    archive_write_add_filter_lrzip(in_stack_ffffffffffffff88);
    assertion_equal_int((char *)in_stack_ffffffffffffff98,
                        (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                        (longlong)in_stack_ffffffffffffff88,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,uVar8),(longlong)paVar4,
                        (char *)0x1dadcf,in_stack_ffffffffffffffb0);
    archive_write_open_memory
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88
               ,(size_t *)CONCAT44(in_stack_ffffffffffffff84,uVar8));
    wVar1 = (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20);
    assertion_equal_int((char *)in_stack_ffffffffffffff98,wVar1,(longlong)in_stack_ffffffffffffff88,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,uVar8),(longlong)paVar4,
                        (char *)0x1dae17,in_stack_ffffffffffffffb0);
    archive_write_close((archive *)0x1dae21);
    assertion_equal_int((char *)in_stack_ffffffffffffff98,wVar1,(longlong)in_stack_ffffffffffffff88,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,uVar8),0,(char *)0x1dae4f,
                        in_stack_ffffffffffffffb0);
    archive_write_free((archive *)0x1dae59);
    assertion_equal_int((char *)in_stack_ffffffffffffff98,wVar1,(longlong)in_stack_ffffffffffffff88,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,uVar8),0,(char *)0x1dae87,
                        in_stack_ffffffffffffffb0);
    free(__s);
    free(__ptr);
  }
  return;
}

Assistant:

DEFINE_TEST(test_write_filter_lrzip)
{
	struct archive_entry *ae;
	struct archive* a;
	char *buff, *data;
	size_t buffsize, datasize;
	char path[16];
	size_t used1, used2;
	int i;

	if (!canLrzip()) {
		skipping("lrzip command-line program not found");
		return;
	}

	buffsize = 2000000;
	assert(NULL != (buff = (char *)malloc(buffsize)));

	datasize = 10000;
	assert(NULL != (data = (char *)malloc(datasize)));
	memset(data, 0, datasize);

	/*
	 * Write 100 files and read them all back.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_gnutar(a));
	assertEqualIntA(a, ARCHIVE_WARN, archive_write_add_filter_lrzip(a));
	assertEqualIntA(a, ARCHIVE_OK,
		archive_write_set_bytes_per_block(a, 10));
	assertEqualInt(ARCHIVE_FILTER_LRZIP, archive_filter_code(a, 0));
	assertEqualString("lrzip", archive_filter_name(a, 0));
	assertEqualIntA(a, ARCHIVE_OK,
		archive_write_open_memory(a, buff, buffsize, &used1));
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_filetype(ae, AE_IFREG);
	archive_entry_set_size(ae, datasize);
	for (i = 0; i < 100; i++) {
		sprintf(path, "file%03d", i);
		archive_entry_copy_pathname(ae, path);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize
		    == (size_t)archive_write_data(a, data, datasize));
	}
	archive_entry_free(ae);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_WARN, archive_read_support_filter_lrzip(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_memory(a, buff, used1));
	for (i = 0; i < 100; i++) {
		sprintf(path, "file%03d", i);
		if (!assertEqualInt(ARCHIVE_OK,
			archive_read_next_header(a, &ae)))
			break;
		assertEqualString(path, archive_entry_pathname(ae));
		assertEqualInt((int)datasize, archive_entry_size(ae));
	}
	assertEqualInt(ARCHIVE_FILTER_LRZIP, archive_filter_code(a, 0));
	assertEqualString("lrzip", archive_filter_name(a, 0));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Test various premature shutdown scenarios to make sure we
	 * don't crash or leak memory.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_WARN, archive_write_add_filter_lrzip(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_WARN, archive_write_add_filter_lrzip(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_WARN, archive_write_add_filter_lrzip(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_WARN, archive_write_add_filter_lrzip(a));
	assertEqualIntA(a, ARCHIVE_OK,
		archive_write_open_memory(a, buff, buffsize, &used2));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Clean up.
	 */
	free(data);
	free(buff);
}